

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlIO(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  xmlParserCtxtPtr pxVar15;
  long lVar16;
  xmlBufferPtr pxVar17;
  size_t sVar18;
  FILE *pFVar19;
  xmlParserInputBufferPtr pxVar20;
  int test_ret_2;
  int n_path;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong in_RSI;
  ulong uVar25;
  undefined *puVar26;
  int test_ret_3;
  int iVar27;
  uint uVar28;
  undefined4 *puVar29;
  undefined8 *puVar30;
  char *pcVar31;
  int test_ret_1;
  uint *puVar32;
  int test_ret_32;
  undefined4 uVar33;
  int n_enc;
  uint uVar34;
  bool bVar35;
  int test_ret;
  int test_ret_5;
  int test_ret_4;
  int test_ret_14;
  int test_ret_13;
  int test_ret_27;
  int local_50;
  int local_4c;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlIO : 40 of 50 functions ...");
  }
  iVar1 = xmlMemBlocks();
  uVar14 = xmlAllocOutputBuffer(0);
  xmlOutputBufferClose(uVar14);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlAllocOutputBuffer");
    in_RSI = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar29 = &DAT_00155228;
  uVar21 = 0;
  local_50 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar33 = 0xffffffff;
    if (uVar21 < 3) {
      uVar33 = *puVar29;
    }
    uVar14 = xmlAllocParserInputBuffer(uVar33);
    xmlFreeParserInputBuffer(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlAllocParserInputBuffer",(ulong)(uint)(iVar4 - iVar3));
      local_50 = local_50 + 1;
      in_RSI = (ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar21 != 4);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d58;
  uVar21 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar21 < 3) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlCheckFilename(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckFilename",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      in_RSI = (ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)in_RSI;
    iVar6 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(iVar5,iVar7);
    in_RSI = 0;
    uVar14 = xmlCheckHTTPInput(pxVar15);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar15);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckHTTPInput",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlCleanupInputCallbacks();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCleanupInputCallbacks");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlCleanupOutputCallbacks();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCleanupOutputCallbacks");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar22 = 0;
  iVar27 = 0;
  do {
    iVar9 = xmlMemBlocks();
    xmlFileClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileClose",(ulong)(uint)(iVar10 - iVar9));
      iVar27 = iVar27 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 == 1);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  iVar22 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlFileMatch(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileMatch",(ulong)(uint)(iVar10 - iVar9));
      iVar22 = iVar22 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  local_4c = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlFileOpen(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileOpen",(ulong)(uint)(iVar10 - iVar9));
      local_4c = local_4c + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar25 = 0;
  do {
    puVar29 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar10 = xmlMemBlocks();
      uVar33 = 0xffffffff;
      if (uVar21 < 4) {
        uVar33 = *puVar29;
      }
      xmlFileRead(0,0,uVar33);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      iVar12 = (int)uVar25;
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlFileRead",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",uVar25);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar21 != 4);
    uVar25 = (ulong)(iVar12 + 1);
  } while (iVar12 == 0);
  function_tests = function_tests + 1;
  iVar10 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    xmlIOFTPClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPClose",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 == 1);
  iVar1 = local_50 + (uint)(iVar1 != iVar2) + iVar3 + iVar4 + (uint)(iVar5 != iVar6) +
          (uint)(iVar7 != iVar8) + iVar27 + iVar22 + local_4c;
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlIOFTPMatch(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPMatch",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  local_4c = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlIOFTPOpen(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPOpen",(ulong)(uint)(iVar4 - iVar3));
      local_4c = local_4c + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar25 = 0;
  do {
    puVar29 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar4 = xmlMemBlocks();
      uVar33 = 0xffffffff;
      if (uVar21 < 4) {
        uVar33 = *puVar29;
      }
      xmlIOFTPRead(0,0,uVar33);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      iVar6 = (int)uVar25;
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIOFTPRead",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",uVar25);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar21 != 4);
    uVar25 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    xmlIOHTTPClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPClose",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 == 1);
  iVar1 = iVar1 + iVar9 + iVar11 + iVar2 + local_4c;
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  iVar2 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlIOHTTPMatch(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar4 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPMatch",(ulong)(uint)(iVar6 - iVar4));
      iVar2 = iVar2 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d90;
  uVar21 = 0;
  local_38 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar21 < 7) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    xmlIOHTTPOpen(uVar14);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar4 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPOpen",(ulong)(uint)(iVar6 - iVar4));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar25 = 0;
  do {
    puVar29 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar4 = xmlMemBlocks();
      uVar33 = 0xffffffff;
      if (uVar21 < 4) {
        uVar33 = *puVar29;
      }
      uVar24 = 0;
      xmlIOHTTPRead(0,0,uVar33);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      iVar7 = (int)uVar25;
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIOHTTPRead",(ulong)(uint)(iVar6 - iVar4));
        local_3c = local_3c + 1;
        printf(" %d",uVar25);
        printf(" %d",0);
        uVar24 = (ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar21 != 4);
    uVar25 = (ulong)(iVar7 + 1);
  } while (iVar7 == 0);
  function_tests = function_tests + 1;
  local_4c = 0;
  uVar21 = 0;
  do {
    uVar25 = 0;
    do {
      uVar23 = 0;
      do {
        iVar6 = (int)uVar24;
        iVar4 = xmlMemBlocks();
        if (uVar21 < 7) {
          uVar14 = (&DAT_00165d90)[uVar21];
        }
        else {
          uVar14 = 0;
        }
        if ((uint)uVar25 < 3) {
          uVar24 = (&DAT_00165d58)[uVar25];
        }
        else {
          uVar24 = 0;
        }
        pxVar15 = gen_xmlParserCtxtPtr(uVar23,iVar6);
        uVar14 = xmlNoNetExternalEntityLoader(uVar14,uVar24,pxVar15);
        xmlFreeInputStream(uVar14);
        call_tests = call_tests + 1;
        if (pxVar15 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar15);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar4 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNoNetExternalEntityLoader",
                 (ulong)(uint)(iVar6 - iVar4));
          local_4c = local_4c + 1;
          printf(" %d",(ulong)uVar21);
          printf(" %d",uVar25);
          uVar24 = (ulong)uVar23;
          printf(" %d");
          putchar(10);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
      uVar23 = (uint)uVar25 + 1;
      uVar25 = (ulong)uVar23;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 8);
  function_tests = function_tests + 1;
  puVar30 = &DAT_00165d70;
  uVar21 = 0;
  iVar4 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar21 < 4) {
      uVar14 = *puVar30;
    }
    else {
      uVar14 = 0;
    }
    lVar16 = xmlNormalizeWindowsPath(uVar14);
    if (lVar16 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNormalizeWindowsPath",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      uVar24 = (ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar21 != 5);
  iVar1 = iVar1 + iVar3 + iVar5 + iVar2 + local_38 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  iVar2 = 0;
  do {
    iVar5 = (int)uVar24;
    iVar3 = xmlMemBlocks();
    pxVar17 = gen_xmlBufferPtr(iVar2,iVar5);
    uVar24 = 0;
    uVar14 = xmlOutputBufferCreateBuffer(pxVar17);
    xmlOutputBufferClose(uVar14);
    call_tests = call_tests + 1;
    if (pxVar17 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar17);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateBuffer",(ulong)(uint)(iVar5 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d");
      uVar24 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  iVar1 = iVar1 + local_4c;
  function_tests = function_tests + 1;
  puVar29 = &DAT_00163454;
  iVar2 = 0;
  uVar21 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar33 = 0xffffffff;
    if (uVar21 < 4) {
      uVar33 = *puVar29;
    }
    uVar14 = xmlOutputBufferCreateFd(uVar33,0);
    xmlOutputBufferClose(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateFd",(ulong)(uint)(iVar5 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar21 != 4);
  function_tests = function_tests + 1;
  local_4c = 0;
  iVar3 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (iVar3 == 0) {
      pFVar19 = fopen64("test.out","a+");
    }
    else {
      pFVar19 = (FILE *)0x0;
    }
    uVar14 = xmlOutputBufferCreateFile(pFVar19,0);
    xmlOutputBufferClose(uVar14);
    call_tests = call_tests + 1;
    if (pFVar19 != (FILE *)0x0) {
      fclose(pFVar19);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateFile",(ulong)(uint)(iVar6 - iVar5));
      local_4c = local_4c + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar21 = 0;
  do {
    puVar29 = &DAT_00163454;
    uVar23 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar21 < 5) {
        puVar26 = (&PTR_anon_var_dwarf_65b_00165d30)[uVar21];
      }
      else {
        puVar26 = (undefined *)0x0;
      }
      uVar33 = 0xffffffff;
      if (uVar23 < 4) {
        uVar33 = *puVar29;
      }
      xmlOutputBufferCreateFilename(puVar26,0,uVar33);
      xmlOutputBufferClose();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlOutputBufferCreateFilename",
               (ulong)(uint)(iVar6 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      uVar23 = uVar23 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 6);
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_38 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (iVar5 == 0) {
      lVar16 = xmlOutputBufferCreateFilename("test.out",0,0);
    }
    else {
      lVar16 = 0;
    }
    xmlOutputBufferFlush(lVar16);
    call_tests = call_tests + 1;
    if (lVar16 != 0) {
      xmlOutputBufferClose(lVar16);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferFlush",(ulong)(uint)(iVar7 - iVar6));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 == 1);
  iVar1 = iVar1 + iVar4 + local_3c + iVar2 + local_4c;
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_3c = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar16 = xmlOutputBufferCreateFilename("test.out",0,0);
    }
    else {
      lVar16 = 0;
    }
    xmlOutputBufferGetContent(lVar16);
    call_tests = call_tests + 1;
    if (lVar16 != 0) {
      xmlOutputBufferClose(lVar16);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferGetContent",(ulong)(uint)(iVar5 - iVar4));
      local_3c = local_3c + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  local_4c = 0;
  local_48 = 0;
  do {
    uVar21 = 0;
    do {
      iVar2 = 0;
      do {
        iVar4 = xmlMemBlocks();
        if ((int)local_48 == 0) {
          lVar16 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          lVar16 = 0;
        }
        iVar5 = -1;
        if (uVar21 < 4) {
          iVar5 = (&DAT_00163454)[uVar21];
        }
        if (iVar2 == 0) {
          bVar35 = false;
          pcVar31 = "foo";
        }
        else if (iVar2 == 2) {
          bVar35 = false;
          pcVar31 = "test/ent2";
        }
        else if (iVar2 == 1) {
          bVar35 = false;
          pcVar31 = "<foo/>";
        }
        else {
          bVar35 = true;
          pcVar31 = (char *)0x0;
        }
        if ((bVar35) || (sVar18 = strlen(pcVar31), iVar5 <= (int)sVar18 + 1)) {
          xmlOutputBufferWrite(lVar16,iVar5,pcVar31);
          call_tests = call_tests + 1;
          if (lVar16 != 0) {
            xmlOutputBufferClose(lVar16);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlOutputBufferWrite",(ulong)(uint)(iVar5 - iVar4));
            local_4c = local_4c + 1;
            printf(" %d",local_48);
            printf(" %d",(ulong)uVar21);
            printf(" %d");
            putchar(10);
          }
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    bVar35 = (int)local_48 == 0;
    local_48 = (ulong)((int)local_48 + 1);
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar21 = 0;
  do {
    iVar4 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar21 == 0) {
        lVar16 = xmlOutputBufferCreateFilename("test.out",0,0);
      }
      else {
        lVar16 = 0;
      }
      xmlOutputBufferWriteString(lVar16);
      call_tests = call_tests + 1;
      if (lVar16 != 0) {
        xmlOutputBufferClose(lVar16);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlOutputBufferWriteString",(ulong)(uint)(iVar6 - iVar5))
        ;
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d");
        putchar(10);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    bVar35 = uVar21 == 0;
    uVar21 = uVar21 + 1;
  } while (bVar35);
  iVar1 = iVar1 + iVar3 + local_38 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar21 = 0;
  do {
    puVar29 = &DAT_00155228;
    uVar25 = 0;
    do {
      iVar3 = xmlMemBlocks();
      uVar33 = 0xffffffff;
      if ((uint)uVar25 < 3) {
        uVar33 = *puVar29;
      }
      uVar14 = xmlParserInputBufferCreateFd(0xffffffff,uVar33);
      xmlFreeParserInputBuffer(uVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFd",
               (ulong)(uint)(iVar4 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d",uVar25);
        putchar(10);
      }
      uVar23 = (uint)uVar25 + 1;
      uVar25 = (ulong)uVar23;
      puVar29 = puVar29 + 1;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar21 = 0;
  do {
    puVar29 = &DAT_00155228;
    uVar23 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar21 == 0) {
        pFVar19 = fopen64("test.out","a+");
      }
      else {
        pFVar19 = (FILE *)0x0;
      }
      uVar33 = 0xffffffff;
      if (uVar23 < 3) {
        uVar33 = *puVar29;
      }
      uVar14 = xmlParserInputBufferCreateFile(pFVar19,uVar33);
      xmlFreeParserInputBuffer(uVar14);
      call_tests = call_tests + 1;
      if (pFVar19 != (FILE *)0x0) {
        fclose(pFVar19);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFile",
               (ulong)(uint)(iVar4 - iVar3));
        local_38 = local_38 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d",(ulong)uVar23);
        putchar(10);
      }
      uVar23 = uVar23 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar23 != 4);
    bVar35 = uVar21 == 0;
    uVar21 = uVar21 + 1;
  } while (bVar35);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar21 = 0;
  do {
    puVar32 = &DAT_00155228;
    uVar23 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar21 < 5) {
        puVar26 = (&PTR_anon_var_dwarf_65b_00165d30)[uVar21];
      }
      else {
        puVar26 = (undefined *)0x0;
      }
      uVar25 = 0xffffffff;
      if (uVar23 < 3) {
        uVar25 = (ulong)*puVar32;
      }
      xmlParserInputBufferCreateFilename(puVar26);
      xmlFreeParserInputBuffer();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFilename",
               (ulong)(uint)(iVar4 - iVar3));
        local_34 = local_34 + 1;
        printf(" %d",(ulong)uVar21);
        uVar25 = (ulong)uVar23;
        printf(" %d");
        putchar(10);
      }
      uVar23 = uVar23 + 1;
      puVar32 = puVar32 + 1;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 6);
  iVar1 = iVar1 + local_4c + iVar2 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar21 = 0;
  do {
    uVar23 = 0;
    do {
      uVar24 = 0;
      puVar29 = &DAT_00155228;
      do {
        iVar2 = xmlMemBlocks();
        if (uVar21 == 0) {
          pcVar31 = "foo";
LAB_0013d5b3:
          bVar35 = false;
        }
        else {
          if (uVar21 == 2) {
            pcVar31 = "test/ent2";
            goto LAB_0013d5b3;
          }
          if (uVar21 == 1) {
            bVar35 = false;
            pcVar31 = "<foo/>";
          }
          else {
            bVar35 = true;
            pcVar31 = (char *)0x0;
          }
        }
        uVar33 = 0xffffffff;
        uVar34 = 0xffffffff;
        if (uVar23 < 4) {
          uVar34 = (&DAT_00163454)[uVar23];
        }
        uVar28 = (uint)uVar24;
        if (uVar28 < 3) {
          uVar33 = *puVar29;
        }
        if ((bVar35) || (sVar18 = strlen(pcVar31), (int)uVar34 <= (int)sVar18 + 1)) {
          uVar25 = (ulong)uVar34;
          uVar14 = xmlParserInputBufferCreateMem(pcVar31,uVar25,uVar33);
          xmlFreeParserInputBuffer(uVar14);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
                   (ulong)(uint)(iVar3 - iVar2));
            local_3c = local_3c + 1;
            printf(" %d",(ulong)uVar21);
            printf(" %d",(ulong)uVar23);
            printf(" %d");
            putchar(10);
            uVar25 = uVar24;
          }
        }
        uVar28 = uVar28 + 1;
        uVar24 = (ulong)uVar28;
        puVar29 = puVar29 + 1;
      } while (uVar28 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  iVar1 = iVar1 + local_38;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar21 = 0;
  do {
    uVar23 = 0;
    do {
      uVar24 = 0;
      puVar29 = &DAT_00155228;
      do {
        iVar2 = xmlMemBlocks();
        if (uVar21 == 0) {
          pcVar31 = "foo";
LAB_0013d720:
          bVar35 = false;
        }
        else {
          if (uVar21 == 2) {
            pcVar31 = "test/ent2";
            goto LAB_0013d720;
          }
          if (uVar21 == 1) {
            bVar35 = false;
            pcVar31 = "<foo/>";
          }
          else {
            bVar35 = true;
            pcVar31 = (char *)0x0;
          }
        }
        uVar33 = 0xffffffff;
        uVar34 = 0xffffffff;
        if (uVar23 < 4) {
          uVar34 = (&DAT_00163454)[uVar23];
        }
        uVar28 = (uint)uVar24;
        if (uVar28 < 3) {
          uVar33 = *puVar29;
        }
        if ((bVar35) || (sVar18 = strlen(pcVar31), (int)uVar34 <= (int)sVar18 + 1)) {
          uVar25 = (ulong)uVar34;
          uVar14 = xmlParserInputBufferCreateStatic(pcVar31,uVar25,uVar33);
          xmlFreeParserInputBuffer(uVar14);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferCreateStatic",
                   (ulong)(uint)(iVar3 - iVar2));
            local_38 = local_38 + 1;
            printf(" %d",(ulong)uVar21);
            printf(" %d",(ulong)uVar23);
            printf(" %d");
            putchar(10);
            uVar25 = uVar24;
          }
        }
        uVar28 = uVar28 + 1;
        uVar24 = (ulong)uVar28;
        puVar29 = puVar29 + 1;
      } while (uVar28 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 4);
    uVar21 = uVar21 + 1;
    if (uVar21 == 4) {
      iVar1 = iVar1 + local_34;
      function_tests = function_tests + 1;
      local_34 = 0;
      uVar24 = 0;
      do {
        puVar32 = &DAT_00163454;
        uVar21 = 0;
        do {
          iVar3 = (int)uVar25;
          iVar2 = xmlMemBlocks();
          pxVar20 = gen_xmlParserInputBufferPtr((int)uVar24,iVar3);
          uVar25 = 0xffffffff;
          if (uVar21 < 4) {
            uVar25 = (ulong)*puVar32;
          }
          xmlParserInputBufferGrow(pxVar20);
          call_tests = call_tests + 1;
          xmlFreeParserInputBuffer(pxVar20);
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferGrow",
                   (ulong)(uint)(iVar3 - iVar2));
            local_34 = local_34 + 1;
            printf(" %d",uVar24);
            uVar25 = (ulong)uVar21;
            printf(" %d");
            putchar(10);
          }
          uVar21 = uVar21 + 1;
          puVar32 = puVar32 + 1;
        } while (uVar21 != 4);
        uVar21 = (int)uVar24 + 1;
        uVar24 = (ulong)uVar21;
      } while (uVar21 != 8);
      function_tests = function_tests + 1;
      local_4c = 0;
      uVar21 = 0;
      do {
        uVar23 = 0;
        do {
          uVar24 = 0;
          do {
            iVar2 = xmlMemBlocks();
            pxVar20 = gen_xmlParserInputBufferPtr(uVar21,(int)uVar25);
            uVar34 = 0xffffffff;
            if (uVar23 < 4) {
              uVar34 = (&DAT_00163454)[uVar23];
            }
            iVar3 = (int)uVar24;
            if (iVar3 == 0) {
              bVar35 = false;
              pcVar31 = "foo";
            }
            else if (iVar3 == 2) {
              bVar35 = false;
              pcVar31 = "test/ent2";
            }
            else if (iVar3 == 1) {
              bVar35 = false;
              pcVar31 = "<foo/>";
            }
            else {
              bVar35 = true;
              pcVar31 = (char *)0x0;
            }
            if ((bVar35) || (sVar18 = strlen(pcVar31), (int)uVar34 <= (int)sVar18 + 1)) {
              uVar25 = (ulong)uVar34;
              xmlParserInputBufferPush(pxVar20,uVar25,pcVar31);
              call_tests = call_tests + 1;
              xmlFreeParserInputBuffer(pxVar20);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlParserInputBufferPush",
                       (ulong)(uint)(iVar4 - iVar2));
                local_4c = local_4c + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar23);
                printf(" %d");
                putchar(10);
                uVar25 = uVar24;
              }
            }
            uVar24 = (ulong)(iVar3 + 1U);
          } while (iVar3 + 1U != 4);
          uVar23 = uVar23 + 1;
        } while (uVar23 != 4);
        uVar21 = uVar21 + 1;
      } while (uVar21 != 8);
      function_tests = function_tests + 1;
      iVar2 = 0;
      uVar21 = 0;
      do {
        puVar32 = &DAT_00163454;
        uVar23 = 0;
        do {
          iVar4 = (int)uVar25;
          iVar3 = xmlMemBlocks();
          pxVar20 = gen_xmlParserInputBufferPtr(uVar21,iVar4);
          uVar25 = 0xffffffff;
          if (uVar23 < 4) {
            uVar25 = (ulong)*puVar32;
          }
          xmlParserInputBufferRead(pxVar20);
          call_tests = call_tests + 1;
          xmlFreeParserInputBuffer(pxVar20);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferRead",
                   (ulong)(uint)(iVar4 - iVar3));
            iVar2 = iVar2 + 1;
            printf(" %d",(ulong)uVar21);
            uVar25 = (ulong)uVar23;
            printf(" %d");
            putchar(10);
          }
          uVar23 = uVar23 + 1;
          puVar32 = puVar32 + 1;
        } while (uVar23 != 4);
        uVar21 = uVar21 + 1;
      } while (uVar21 != 8);
      function_tests = function_tests + 1;
      iVar3 = xmlMemBlocks();
      xmlPopInputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlPopInputCallbacks",(ulong)(uint)(iVar5 - iVar3));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar5 = xmlMemBlocks();
      xmlRegisterDefaultInputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterDefaultInputCallbacks",
               (ulong)(uint)(iVar7 - iVar5));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar7 = xmlMemBlocks();
      xmlRegisterDefaultOutputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterDefaultOutputCallbacks",
               (ulong)(uint)(iVar22 - iVar7));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar22 = xmlMemBlocks();
      xmlRegisterHTTPPostCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar27 = xmlMemBlocks();
      if (iVar22 != iVar27) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterHTTPPostCallbacks",
               (ulong)(uint)(iVar9 - iVar22));
        putchar(10);
      }
      function_tests = function_tests + 1;
      uVar21 = local_4c + iVar2 + iVar1 + local_3c + local_38 + local_34 + (uint)(iVar3 != iVar4) +
               (uint)(iVar5 != iVar6) + (uint)(iVar7 != iVar8) + (uint)(iVar22 != iVar27);
      if (uVar21 != 0) {
        printf("Module xmlIO: %d errors\n",(ulong)uVar21);
      }
      return uVar21;
    }
  } while( true );
}

Assistant:

static int
test_xmlIO(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlIO : 40 of 50 functions ...\n");
    test_ret += test_xmlAllocOutputBuffer();
    test_ret += test_xmlAllocParserInputBuffer();
    test_ret += test_xmlCheckFilename();
    test_ret += test_xmlCheckHTTPInput();
    test_ret += test_xmlCleanupInputCallbacks();
    test_ret += test_xmlCleanupOutputCallbacks();
    test_ret += test_xmlFileClose();
    test_ret += test_xmlFileMatch();
    test_ret += test_xmlFileOpen();
    test_ret += test_xmlFileRead();
    test_ret += test_xmlIOFTPClose();
    test_ret += test_xmlIOFTPMatch();
    test_ret += test_xmlIOFTPOpen();
    test_ret += test_xmlIOFTPRead();
    test_ret += test_xmlIOHTTPClose();
    test_ret += test_xmlIOHTTPMatch();
    test_ret += test_xmlIOHTTPOpen();
    test_ret += test_xmlIOHTTPRead();
    test_ret += test_xmlNoNetExternalEntityLoader();
    test_ret += test_xmlNormalizeWindowsPath();
    test_ret += test_xmlOutputBufferCreateBuffer();
    test_ret += test_xmlOutputBufferCreateFd();
    test_ret += test_xmlOutputBufferCreateFile();
    test_ret += test_xmlOutputBufferCreateFilename();
    test_ret += test_xmlOutputBufferFlush();
    test_ret += test_xmlOutputBufferGetContent();
    test_ret += test_xmlOutputBufferGetSize();
    test_ret += test_xmlOutputBufferWrite();
    test_ret += test_xmlOutputBufferWriteEscape();
    test_ret += test_xmlOutputBufferWriteString();
    test_ret += test_xmlParserGetDirectory();
    test_ret += test_xmlParserInputBufferCreateFd();
    test_ret += test_xmlParserInputBufferCreateFile();
    test_ret += test_xmlParserInputBufferCreateFilename();
    test_ret += test_xmlParserInputBufferCreateMem();
    test_ret += test_xmlParserInputBufferCreateStatic();
    test_ret += test_xmlParserInputBufferGrow();
    test_ret += test_xmlParserInputBufferPush();
    test_ret += test_xmlParserInputBufferRead();
    test_ret += test_xmlPopInputCallbacks();
    test_ret += test_xmlRegisterDefaultInputCallbacks();
    test_ret += test_xmlRegisterDefaultOutputCallbacks();
    test_ret += test_xmlRegisterHTTPPostCallbacks();

    if (test_ret != 0)
	printf("Module xmlIO: %d errors\n", test_ret);
    return(test_ret);
}